

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count,N_Vector y,int m,SUNContext sunctx)

{
  undefined8 uVar1;
  SUNNonlinearSolver p_Var2;
  SUNContext in_RCX;
  int in_EDX;
  N_Vector in_RSI;
  undefined4 in_EDI;
  N_Vector w;
  SUNNonlinearSolver NLS;
  SUNContext sunctx_local_scope_;
  
  uVar1 = N_VNew_SensWrapper(in_EDI,in_RSI);
  p_Var2 = SUNNonlinSol_FixedPoint(in_RSI,in_EDX,in_RCX);
  N_VDestroy(uVar1);
  return p_Var2;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPointSens(int count, N_Vector y, int m,
                                               SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNNonlinearSolver NLS = NULL;
  N_Vector w             = NULL;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);
  SUNCheckLastErrNull();

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_FixedPoint(w, m, sunctx);
  SUNCheckLastErrNull();

  /* free sensitivity vector wrapper */
  N_VDestroy(w);
  SUNCheckLastErrNull();

  /* return NLS object */
  return (NLS);
}